

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

int __thiscall ghc::filesystem::rename(filesystem *this,char *__old,char *__new)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  error_code eVar3;
  
  std::error_code::clear((error_code *)__new);
  bVar1 = operator!=((path *)this,(path *)__old);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    iVar2 = ::rename(*(char **)this,*(char **)__old);
    if (iVar2 != 0) {
      eVar3 = detail::make_system_error(0);
      iVar2 = eVar3._M_value;
      *(int *)__new = iVar2;
      *(error_category **)(__new + 8) = eVar3._M_cat;
    }
  }
  return iVar2;
}

Assistant:

GHC_INLINE void rename(const path& from, const path& to, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (from != to) {
        if (!MoveFileExW(GHC_NATIVEWP(from), GHC_NATIVEWP(to), (DWORD)MOVEFILE_REPLACE_EXISTING)) {
            ec = detail::make_system_error();
        }
    }
#else
    if (from != to) {
        if (::rename(from.c_str(), to.c_str()) != 0) {
            ec = detail::make_system_error();
        }
    }
#endif
}